

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scv.c
# Opt level: O0

void * scv_at(scv_vector *v,size_t i)

{
  size_t i_local;
  scv_vector *v_local;
  
  if (v == (scv_vector *)0x0) {
    __assert_fail("v != NULL","/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c"
                  ,0x98,"void *scv_at(struct scv_vector *, size_t)");
  }
  if (v->data != (void *)0x0) {
    if (i < v->size) {
      v_local = (scv_vector *)((long)v->data + i * v->objsize);
    }
    else {
      v_local = (scv_vector *)0x0;
    }
    return v_local;
  }
  __assert_fail("v->data != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]scv/scv.c",0x99,
                "void *scv_at(struct scv_vector *, size_t)");
}

Assistant:

void *scv_at(struct scv_vector *v, size_t i)
{
	assert(v != NULL);
	assert(v->data != NULL);

	if (i >= v->size) {
		return NULL;
	}

	return SCV_AT(v, i);
}